

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLDisplay eglu::getAndInitDisplay(NativeDisplay *nativeDisplay,Version *version)

{
  int iVar1;
  deUint32 err;
  deBool dVar2;
  undefined4 extraout_var;
  Version local_38;
  int local_30;
  int local_2c;
  int minor;
  int major;
  EGLDisplay display;
  Library *egl;
  Version *version_local;
  NativeDisplay *nativeDisplay_local;
  
  egl = (Library *)version;
  version_local = (Version *)nativeDisplay;
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  display = (EGLDisplay)CONCAT44(extraout_var,iVar1);
  _minor = getDisplay((NativeDisplay *)version_local);
  do {
    (**(code **)(*display + 0x128))(display,_minor,&local_2c,&local_30);
    err = (**(code **)(*display + 0xf8))();
    checkError(err,"initialize(display, &major, &minor)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x10f);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if (egl != (Library *)0x0) {
    Version::Version(&local_38,local_2c,local_30);
    egl->_vptr_Library = (_func_int **)local_38;
  }
  return _minor;
}

Assistant:

EGLDisplay getAndInitDisplay (NativeDisplay& nativeDisplay, Version* version)
{
	const Library&	egl		= nativeDisplay.getLibrary();
	EGLDisplay		display	= getDisplay(nativeDisplay);
	int				major, minor;

	EGLU_CHECK_CALL(egl, initialize(display, &major, &minor));

	if (version)
		*version = Version(major, minor);

	return display;
}